

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_hexamine.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int ret;
  input_option opt;
  input_option *in_stack_000014e8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char **in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  memset(&stack0xffffffffffffffd8,0,0x18);
  memleak_start();
  local_4 = parse_options(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                          (input_option *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    local_4 = process_file(in_stack_000014e8);
    fdb_shutdown();
    memleak_end();
  }
  else {
    memleak_end();
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
    struct input_option opt;
    memset(&opt, 0 , sizeof(struct input_option));
    opt.max_filesize = MAX_FILE_SIZE;
    memleak_start();
    int ret = parse_options(argc, argv, &opt);

    if (ret) {
        memleak_end();
        return ret;
    }

    ret = process_file(&opt);

    fdb_shutdown();
    memleak_end();
    return ret;
}